

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

ON_AggregateComponentStatusEx *
ON_Internal_AggregateComponentStatusEx_Init
          (ON_AggregateComponentStatusEx *__return_storage_ptr__,int k)

{
  ON_AggregateComponentStatusEx *s;
  ON_AggregateComponentStatus local_2c;
  int local_c;
  int k_local;
  
  local_c = k;
  ON_Internal_AggregateComponentStatus_Init(&local_2c,k);
  ON_AggregateComponentStatusEx::ON_AggregateComponentStatusEx(__return_storage_ptr__,&local_2c);
  __return_storage_ptr__->m_component_status_serial_number = 0;
  return __return_storage_ptr__;
}

Assistant:

static ON_AggregateComponentStatusEx ON_Internal_AggregateComponentStatusEx_Init(int k)
{
  ON_AggregateComponentStatusEx s(ON_Internal_AggregateComponentStatus_Init(k));
  *((ON__UINT64*)(((char*)(&s)) + sizeof(ON_AggregateComponentStatus))) = 0; // m_component_status_serial_number = 0 
  return s;
}